

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

float * glfwGetJoystickAxes(int jid,int *count)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x3d2,"const float *glfwGetJoystickAxes(int, int *)");
  }
  uVar1 = (ulong)(uint)jid;
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x3d3,"const float *glfwGetJoystickAxes(int, int *)");
  }
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x3d4,"const float *glfwGetJoystickAxes(int, int *)");
  }
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar2 = initJoysticks();
    if (((GVar2 != 0) && (_glfw.joysticks[uVar1].present != 0)) &&
       (iVar3 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(uVar1 * 0x2018 + 0x14ab20),1),
       iVar3 != 0)) {
      *count = _glfw.joysticks[uVar1].axisCount;
      return _glfw.joysticks[uVar1].axes;
    }
  }
  return (float *)0x0;
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_AXES))
        return NULL;

    *count = js->axisCount;
    return js->axes;
}